

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_2_param(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPParserContext *parser;
  PVIPNode **ppPVar1;
  PVIPNode *pPVar2;
  PVIPNode *pPVar3;
  PVIPNode *n2;
  uint uVar4;
  PVIPNode *pPVar5;
  PVIPNode *n3;
  PVIPNode *pPVar6;
  uint uVar7;
  
  ppPVar1 = G->val;
  pPVar5 = ppPVar1[-6];
  pPVar6 = ppPVar1[-3];
  pPVar2 = ppPVar1[-2];
  pPVar3 = ppPVar1[-1];
  parser = &G->data;
  if (pPVar5 == (PVIPNode *)0x0) {
    pPVar5 = PVIP_node_new_children(parser,PVIP_NODE_NOP);
  }
  n2 = G->val[-5];
  n3 = G->val[-4];
  if (n3 == (PVIPNode *)0x0) {
    n3 = PVIP_node_new_children(parser,PVIP_NODE_NOP);
  }
  uVar7 = (pPVar6 != (PVIPNode *)0x0) + 2;
  if (pPVar2 == (PVIPNode *)0x0) {
    uVar7 = (uint)(pPVar6 != (PVIPNode *)0x0);
  }
  uVar4 = uVar7 + 4;
  if (pPVar3 == (PVIPNode *)0x0) {
    uVar4 = uVar7;
  }
  pPVar6 = PVIP_node_new_int(parser,PVIP_NODE_INT,(ulong)uVar4);
  pPVar5 = PVIP_node_new_children4(parser,PVIP_NODE_PARAM,pPVar5,n2,n3,pPVar6);
  G->ss = pPVar5;
  return;
}

Assistant:

YY_ACTION(void) yy_2_param(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define is_ref G->val[-1]
#define is_rw G->val[-2]
#define is_copy G->val[-3]
#define d G->val[-4]
#define v G->val[-5]
#define i G->val[-6]
  yyprintf((stderr, "do yy_2_param"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        int attr = 0;\n\
        if (is_copy) {\n\
            attr |= PVIP_FUNC_ATTR_IS_COPY;\n\
        }\n\
        if (is_rw) {\n\
            attr |= PVIP_FUNC_ATTR_IS_RW;\n\
        }\n\
        if (is_ref) {\n\
            attr |= PVIP_FUNC_ATTR_IS_REF;\n\
        }\n\
        yy = CHILDREN4(PVIP_NODE_PARAM, MAYBE(i), v, MAYBE(d), PVIP_node_new_int(&(G->data), PVIP_NODE_INT, attr));\n\
    }\n"));
  
        int attr = 0;
        if (is_copy) {
            attr |= PVIP_FUNC_ATTR_IS_COPY;
        }
        if (is_rw) {
            attr |= PVIP_FUNC_ATTR_IS_RW;
        }
        if (is_ref) {
            attr |= PVIP_FUNC_ATTR_IS_REF;
        }
        yy = CHILDREN4(PVIP_NODE_PARAM, MAYBE(i), v, MAYBE(d), PVIP_node_new_int(&(G->data), PVIP_NODE_INT, attr));
    ;
#undef is_ref
#undef is_rw
#undef is_copy
#undef d
#undef v
#undef i
}